

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int poly(double *A,double *B,double *C,int lA,int lB)

{
  int iVar1;
  double local_40;
  double temp;
  int k;
  int j;
  int i;
  int lC;
  int lB_local;
  int lA_local;
  double *C_local;
  double *B_local;
  double *A_local;
  
  iVar1 = lA + lB + -1;
  for (k = 0; k < iVar1; k = k + 1) {
    C[k] = 0.0;
  }
  for (k = 0; k < iVar1; k = k + 1) {
    local_40 = 0.0;
    for (temp._4_4_ = 0; temp._4_4_ < lA; temp._4_4_ = temp._4_4_ + 1) {
      for (temp._0_4_ = 0; temp._0_4_ < lB; temp._0_4_ = temp._0_4_ + 1) {
        if (temp._4_4_ + temp._0_4_ == k) {
          local_40 = A[temp._4_4_] * B[temp._0_4_] + local_40;
        }
      }
    }
    C[k] = local_40;
  }
  return iVar1;
}

Assistant:

int poly(double *A, double *B, double *C, int lA, int lB) {
	int lC,i,j,k;
	double temp;
	lC = lA + lB - 1;
	
	for(i = 0; i < lC;++i) {
			C[i] = 0.;
	}
	
	for(i = 0; i < lC;++i) {
		temp = 0.0;
		for(j = 0; j < lA;++j) {
			for(k = 0; k < lB;++k) {
				if (j + k == i) {
					temp += A[j] * B[k];
				}
			}
		}
		C[i] = temp;
			
	}
	
		
	return lC;
}